

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::WriteChannelInfo
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels)

{
  size_type sVar1;
  long lVar2;
  void *__src;
  size_t __n;
  const_reference pvVar3;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_RSI;
  int y_sampling;
  int x_sampling;
  int pixel_type;
  size_t c_1;
  uchar *p;
  size_t c;
  size_t sz;
  size_type in_stack_ffffffffffffff98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa0;
  int *__dest;
  ulong uVar4;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar5;
  int local_38;
  int local_34;
  ulong local_30;
  int *local_28;
  ulong local_20;
  long local_18;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *local_10;
  
  local_18 = 0;
  local_20 = 0;
  local_10 = in_RSI;
  while( true ) {
    uVar4 = local_20;
    sVar1 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::size
                      (local_10);
    if (sVar1 <= uVar4) break;
    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
              (local_10,local_20);
    lVar2 = std::__cxx11::string::length();
    local_18 = lVar2 + local_18 + 0x11;
    local_20 = local_20 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar4);
  local_28 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_30 = 0;
  while( true ) {
    uVar4 = local_30;
    sVar1 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::size
                      (local_10);
    if (sVar1 <= uVar4) break;
    __dest = local_28;
    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
              (local_10,local_30);
    __src = (void *)std::__cxx11::string::c_str();
    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
              (local_10,local_30);
    __n = std::__cxx11::string::length();
    memcpy(__dest,__src,__n);
    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
              (local_10,local_30);
    lVar2 = std::__cxx11::string::length();
    *(reference)(lVar2 + (long)local_28) = '\0';
    local_28 = (int *)((reference)(lVar2 + (long)local_28) + 1);
    pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_10,local_30);
    local_34 = pvVar3->requested_pixel_type;
    pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_10,local_30);
    local_38 = pvVar3->x_sampling;
    pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_10,local_30);
    iVar5 = pvVar3->y_sampling;
    swap4(&local_34);
    swap4(&local_38);
    swap4((int *)&stack0xffffffffffffffc4);
    *local_28 = local_34;
    local_28 = local_28 + 1;
    pvVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_10,local_30);
    *(uchar *)local_28 = pvVar3->p_linear;
    local_28[1] = local_38;
    local_28[2] = iVar5;
    local_28 = local_28 + 3;
    local_30 = local_30 + 1;
  }
  *(value_type *)local_28 = '\0';
  return;
}

Assistant:

static void WriteChannelInfo(std::vector<unsigned char> &data,
                             const std::vector<ChannelInfo> &channels) {
  size_t sz = 0;

  // Calculate total size.
  for (size_t c = 0; c < channels.size(); c++) {
    sz += channels[c].name.length() + 1;  // +1 for \0
    sz += 16;                                    // 4 * int
  }
  data.resize(sz + 1);

  unsigned char *p = &data.at(0);

  for (size_t c = 0; c < channels.size(); c++) {
    memcpy(p, channels[c].name.c_str(), channels[c].name.length());
    p += channels[c].name.length();
    (*p) = '\0';
    p++;

    int pixel_type = channels[c].requested_pixel_type;
    int x_sampling = channels[c].x_sampling;
    int y_sampling = channels[c].y_sampling;
    tinyexr::swap4(&pixel_type);
    tinyexr::swap4(&x_sampling);
    tinyexr::swap4(&y_sampling);

    memcpy(p, &pixel_type, sizeof(int));
    p += sizeof(int);

    (*p) = channels[c].p_linear;
    p += 4;

    memcpy(p, &x_sampling, sizeof(int));
    p += sizeof(int);

    memcpy(p, &y_sampling, sizeof(int));
    p += sizeof(int);
  }

  (*p) = '\0';
}